

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Detonation_PDU::Decode(Detonation_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer pKVar1;
  pointer pKVar2;
  Descriptor *pDVar3;
  KUINT16 KVar4;
  AttachedPart *pAVar5;
  long lVar6;
  KException *this_00;
  int iVar7;
  undefined7 in_register_00000011;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  *this_01;
  byte bVar8;
  pointer pKVar9;
  KUINT8 paramTyp;
  byte local_59;
  KString local_58;
  KUINT8 *local_38;
  
  KVar4 = KDataStream::GetBufferSize(stream);
  iVar7 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar7 = 0;
  }
  if (iVar7 + (uint)KVar4 < 0x68) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Decode","");
    KException::KException(this_00,&local_58,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar1 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar9 = pKVar1;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar9->_vptr_KRef_Ptr)(pKVar9);
      pKVar9 = pKVar9 + 1;
    } while (pKVar9 != pKVar2);
    (this->m_vVariableParameters).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  Warfare_Header::Decode(&this->super_Warfare_Header,stream,ignoreHeader);
  (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Velocity,stream);
  (*(this->m_LocationWorldCoords).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_LocationWorldCoords,stream);
  if ((this->super_Warfare_Header).super_Header.super_Header6.m_ui8ProtocolVersion < 7) {
    if ((this->m_pDescriptor).m_pRef != (Descriptor *)0x0) goto LAB_0018030d;
    pAVar5 = (AttachedPart *)operator_new(0x20);
    DATA_TYPE::MunitionDescriptor::MunitionDescriptor((MunitionDescriptor *)pAVar5);
    local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022cad8;
    local_58._M_string_length = (size_type)pAVar5;
    local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
    *(RefCounter *)local_58.field_2._M_allocated_capacity = 1;
    if ((AttachedPart *)(this->m_pDescriptor).m_pRef != pAVar5) goto LAB_001802db;
  }
  else {
    bVar8 = (this->super_Warfare_Header).super_Header.super_Header6.field_0x25;
    pDVar3 = (this->m_pDescriptor).m_pRef;
    if ((bVar8 & 3) == 1) {
      if (pDVar3 != (Descriptor *)0x0) goto LAB_0018030d;
      pAVar5 = (AttachedPart *)operator_new(0x18);
      DATA_TYPE::Descriptor::Descriptor((Descriptor *)pAVar5);
    }
    else if ((bVar8 & 3) == 0) {
      if ((pDVar3 != (Descriptor *)0x0) &&
         (lVar6 = __dynamic_cast(pDVar3,&DATA_TYPE::Descriptor::typeinfo,
                                 &DATA_TYPE::MunitionDescriptor::typeinfo,0), lVar6 != 0))
      goto LAB_0018030d;
      pAVar5 = (AttachedPart *)operator_new(0x20);
      DATA_TYPE::MunitionDescriptor::MunitionDescriptor((MunitionDescriptor *)pAVar5);
    }
    else {
      if ((pDVar3 != (Descriptor *)0x0) &&
         (lVar6 = __dynamic_cast(pDVar3,&DATA_TYPE::Descriptor::typeinfo,
                                 &DATA_TYPE::ExplosionDescriptor::typeinfo,0), lVar6 != 0))
      goto LAB_0018030d;
      pAVar5 = (AttachedPart *)operator_new(0x20);
      DATA_TYPE::ExplosionDescriptor::ExplosionDescriptor((ExplosionDescriptor *)pAVar5);
    }
    local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022cad8;
    local_58._M_string_length = (size_type)pAVar5;
    local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
    *(RefCounter *)local_58.field_2._M_allocated_capacity = 1;
    if ((AttachedPart *)(this->m_pDescriptor).m_pRef != pAVar5) {
LAB_001802db:
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::unRef(&this->m_pDescriptor);
      (this->m_pDescriptor).m_pRef = (Descriptor *)local_58._M_string_length;
      (this->m_pDescriptor).m_piCount = (RefCounter *)local_58.field_2._M_allocated_capacity;
      if ((AttachedPart *)local_58._M_string_length != (AttachedPart *)0x0) {
        *(RefCounter *)local_58.field_2._M_allocated_capacity =
             *(RefCounter *)local_58.field_2._M_allocated_capacity + 1;
      }
    }
  }
  local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_0022cad8;
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::unRef
            ((KRef_Ptr<KDIS::DATA_TYPE::Descriptor> *)&local_58);
LAB_0018030d:
  pDVar3 = (this->m_pDescriptor).m_pRef;
  (*(pDVar3->super_DataTypeBase)._vptr_DataTypeBase[3])(pDVar3,stream);
  (*(this->m_LocationEntityCoords).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_LocationEntityCoords,stream);
  KDataStream::Read(stream,&this->m_ui8DetonationResult);
  local_38 = &this->m_ui8NumOfVariableParams;
  KDataStream::Read(stream,local_38);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding1);
  if (this->m_ui8NumOfVariableParams != '\0') {
    this_01 = &this->m_vVariableParameters;
    bVar8 = 0;
    do {
      KVar4 = KDataStream::GetCurrentWritePosition(stream);
      KDataStream::Read(stream,&local_59);
      KDataStream::SetCurrentWritePosition(stream,KVar4);
      pAVar5 = (AttachedPart *)
               DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableParameter>::FactoryDecode
                         ((uint)local_59,stream);
      if (pAVar5 == (AttachedPart *)0x0) {
        if (local_59 == 1) {
          pAVar5 = (AttachedPart *)operator_new(0x30);
          DATA_TYPE::AttachedPart::AttachedPart(pAVar5,stream);
          local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002280f0;
          local_58._M_string_length = (size_type)pAVar5;
          local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(RefCounter *)local_58.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                      *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
        }
        else if (local_59 == 0) {
          pAVar5 = (AttachedPart *)operator_new(0x28);
          DATA_TYPE::ArticulatedPart::ArticulatedPart((ArticulatedPart *)pAVar5,stream);
          local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002280f0;
          local_58._M_string_length = (size_type)pAVar5;
          local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(RefCounter *)local_58.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                      *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
        }
        else {
          pAVar5 = (AttachedPart *)operator_new(0x18);
          DATA_TYPE::VariableParameter::VariableParameter((VariableParameter *)pAVar5,stream);
          local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002280f0;
          local_58._M_string_length = (size_type)pAVar5;
          local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(RefCounter *)local_58.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                      *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
        }
      }
      else {
        local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002280f0;
        local_58._M_string_length = (size_type)pAVar5;
        local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(RefCounter *)local_58.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                    *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
      }
      local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_002280f0;
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::unRef
                ((KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
      bVar8 = bVar8 + 1;
    } while (bVar8 < *local_38);
  }
  return;
}

Assistant:

void Detonation_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < DETONATION_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vVariableParameters.clear();

    Warfare_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_Velocity
           >> KDIS_STREAM m_LocationWorldCoords;

    #if DIS_VERSION < 7

    if( !m_pDescriptor.GetPtr() )
    {
        m_pDescriptor = DescPtr( new MunitionDescriptor() );
    }

    #else

    // If the protocol version is not 7 then treat it as a MunitionDesc
    if( m_ui8ProtocolVersion < 7 )
    {
        if( !m_pDescriptor.GetPtr() )
        {
            m_pDescriptor = DescPtr( new MunitionDescriptor() );
        }
    }
    else // DIS 7
    {
        if( m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI == MunitionDTI ) // Munition
        {
            // Create a descriptor if the desc is null or the incorrect type
            if( !m_pDescriptor.GetPtr() || !dynamic_cast<MunitionDescriptor*>( m_pDescriptor.GetPtr() ) )
            {
                m_pDescriptor = DescPtr( new MunitionDescriptor() );
            }
        }
        else if( m_PDUStatusUnion.m_ui8PDUStatusDTI_RAI_IAI == ExpendableDTI ) // Expendable
        {
            // Create a descriptor if the desc is null or the incorrect type
            if( !m_pDescriptor.GetPtr() || !dynamic_cast<ExpendableDescriptor*>( m_pDescriptor.GetPtr() ) )
            {
                m_pDescriptor = DescPtr( new ExpendableDescriptor() );
            }
        }
        else // Explosion
        {
            // Create a descriptor if the desc is null or the incorrect type
            if( !m_pDescriptor.GetPtr() || !dynamic_cast<ExplosionDescriptor*>( m_pDescriptor.GetPtr() ) )
            {
                m_pDescriptor = DescPtr( new ExplosionDescriptor() );
            }
        }
    }
    #endif

    m_pDescriptor->Decode( stream );

    stream >> KDIS_STREAM m_LocationEntityCoords
           >> m_ui8DetonationResult
           >> m_ui8NumOfVariableParams
           >> m_ui16Padding1;

    for( KUINT8 i = 0; i < m_ui8NumOfVariableParams; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT8 paramTyp;

        // Extract the  type then reset the stream.
        stream >> paramTyp;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        VariableParameter * p = VariableParameter::FactoryDecode( paramTyp, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vVariableParameters.push_back( VarPrmPtr( p ) );
        }
        else
        {
            // Default internals
            switch( paramTyp )
            {
                case ArticulatedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new ArticulatedPart( stream ) ) );
                    break;

                case AttachedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new AttachedPart( stream ) ) );
                    break;

                default:
                    m_vVariableParameters.push_back( VarPrmPtr( new VariableParameter( stream ) ) );
                    break;
            }
        }
    }
}